

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O3

void __thiscall QPushButton::mouseMoveEvent(QPushButton *this,QMouseEvent *e)

{
  long lVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  char cVar4;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [16];
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar3 = QWidget::testAttribute_helper((QWidget *)this,WA_Hover);
  if (bVar3) {
    cVar4 = '\0';
    if ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 2) != 0) {
      auVar6 = QEventPoint::position();
      dVar5 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_
      ;
      bVar3 = 2147483647.0 < dVar5;
      if (dVar5 <= -2147483648.0) {
        dVar5 = -2147483648.0;
      }
      local_38.x1.m_i =
           (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar5);
      dVar5 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_
      ;
      bVar3 = 2147483647.0 < dVar5;
      if (dVar5 <= -2147483648.0) {
        dVar5 = -2147483648.0;
      }
      local_38.y1.m_i =
           (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar5);
      cVar4 = (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1a0))(this);
    }
    if ((bool)cVar4 != ((*(uint *)(lVar1 + 0x2c8) >> 5 & 1) != 0)) {
      pQVar2 = (this->super_QAbstractButton).super_QWidget.data;
      local_38.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
      local_38.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
      local_38.x1.m_i = 0;
      local_38.y1.m_i = 0;
      QWidget::update((QWidget *)this,&local_38);
      *(byte *)(lVar1 + 0x2c8) = *(byte *)(lVar1 + 0x2c8) & 0xdf | cVar4 << 5;
    }
  }
  QAbstractButton::mouseMoveEvent(&this->super_QAbstractButton,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPushButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QPushButton);

    if (testAttribute(Qt::WA_Hover)) {
        bool hit = false;
        if (underMouse())
            hit = hitButton(e->position().toPoint());

        if (hit != d->hovering) {
            update(rect());
            d->hovering = hit;
        }
    }

    QAbstractButton::mouseMoveEvent(e);
}